

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEditPrivate::clearSection(QDateTimeEditPrivate *this,int index)

{
  int pos;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  char *local_70;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pos = QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker
            ((QSignalBlocker *)local_48,(QObject *)(this->super_QAbstractSpinBoxPrivate).edit);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_68,(this->super_QAbstractSpinBoxPrivate).edit);
  iVar2 = (int)this + 0x3d8;
  iVar1 = QDateTimeParser::sectionPos(iVar2);
  if (iVar1 == -1) {
    local_88.d._0_4_ = 2;
    local_88.size._4_4_ = 0;
    local_88.d._4_4_ = 0;
    local_88.ptr._0_4_ = 0;
    local_88.ptr._4_4_ = 0;
    local_88.size._0_4_ = 0;
    local_70 = "default";
    QMessageLogger::warning
              ((char *)&local_88,"QDateTimeEdit: Internal error (%s:%d)",
               "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qdatetimeedit.cpp"
               ,0x7be);
  }
  else {
    iVar2 = QDateTimeParser::sectionSize(iVar2);
    local_88.d._0_4_ = 0;
    local_88.d._4_4_ = 0;
    local_88.ptr._0_4_ = 0;
    local_88.ptr._4_4_ = 0;
    local_88.size._0_4_ = 0;
    local_88.size._4_4_ = 0;
    QString::fill((QChar)(char16_t)&local_88,0x20);
    QString::replace((longlong)&local_68,(long)iVar1,(QString *)(long)iVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QLineEdit::setText((this->super_QAbstractSpinBoxPrivate).edit,(QString *)&local_68);
    QLineEdit::setCursorPosition((this->super_QAbstractSpinBoxPrivate).edit,pos);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::clearSection(int index)
{
    const auto space = u' ';
    int cursorPos = edit->cursorPosition();
    const QSignalBlocker blocker(edit);
    QString t = edit->text();
    const int pos = sectionPos(index);
    if (Q_UNLIKELY(pos == -1)) {
        qWarning("QDateTimeEdit: Internal error (%s:%d)", __FILE__, __LINE__);
        return;
    }
    const int size = sectionSize(index);
    t.replace(pos, size, QString().fill(space, size));
    edit->setText(t);
    edit->setCursorPosition(cursorPos);
    QDTEDEBUG << cursorPos;
}